

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helper.cpp
# Opt level: O1

Image * Test_Helper::uniformRGBImage
                  (Image *__return_storage_ptr__,uint32_t width,uint32_t height,uint8_t value)

{
  ImageTemplate<unsigned_char> local_50;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_50,0,0,'\x01','\x01');
  anon_unknown.dwarf_154ea6::generateImage
            (__return_storage_ptr__,width,height,'\x03',value,&local_50);
  local_50._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_50);
  return __return_storage_ptr__;
}

Assistant:

PenguinV_Image::Image uniformRGBImage( uint32_t width, uint32_t height, uint8_t value )
    {
        return generateImage( width, height, PenguinV_Image::RGB, value);
    }